

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmu-uuid.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *this;
  runtime_error *this_00;
  logic_error *e;
  exception *e_1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    this = std::operator<<((ostream *)&std::cout,
                           "Generates an UUID for an FMU.\nUsage:\n  fmu-uuid <input md.> <placeholder> <output md.> <output hdr.> <macro name>\nArguments:\n  input md.   = Path to model description file for which to generate UUID.\n  placeholder = String in input md. to replace with UUID in output md.\n  output md.  = Path of output model description file.\n  output hdr. = Path of output C header file that defines macro with UUID.\n  macro name  = A name for the macro that contains the UUID string.\n"
                          );
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  else {
    if (argc != 6) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Wrong number of command-line arguments.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar1,&local_49);
    pcVar1 = local_18[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar1,&local_71);
    pcVar1 = local_18[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar1,&local_99);
    pcVar1 = local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
    pcVar1 = local_18[5];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
    std::function<void(std::__cxx11::string_const&)>::function<main::__0,void>
              ((function<void(std::__cxx11::string_const&)> *)&local_110,
               (anon_class_1_0_00000001 *)((long)&e_1 + 7));
    Run(&local_48,&local_70,&local_98,&local_c0,&local_e8,&local_110);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_110);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return 0;
}

Assistant:

int main(int argc, const char* const argv[])
{
    try {
        if (argc < 2) {
            std::cout <<
                "Generates an UUID for an FMU.\n"
                "Usage:\n"
                "  " MY_NAME " <input md.> <placeholder> <output md.> <output hdr.> <macro name>\n"
                "Arguments:\n"
                "  input md.   = Path to model description file for which to generate UUID.\n"
                "  placeholder = String in input md. to replace with UUID in output md.\n"
                "  output md.  = Path of output model description file.\n"
                "  output hdr. = Path of output C header file that defines macro with UUID.\n"
                "  macro name  = A name for the macro that contains the UUID string.\n"
                << std::flush;
        } else if (argc != 6) {
            throw std::runtime_error("Wrong number of command-line arguments.");
        } else {
            Run(argv[1], argv[2], argv[3], argv[4], argv[5],
                [] (const std::string& s) { std::cerr << "Warning: " << s << std::endl; });
        }
    } catch (const std::logic_error& e) {
        std::cerr << "Internal error: " << e.what() << std::endl;
        return 2;
    } catch (const std::exception& e) {
        std::cerr << "Error: " << e.what() << std::endl;
        return 1;
    }
    return 0;
}